

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMathematics.cpp
# Opt level: O2

double chrono::ChNoise(double x,double amp,double freq,int octaves,double amp_ratio)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  
  lVar3 = CH_PAseed;
  dVar7 = 0.0;
  uVar4 = ~(octaves >> 0x1f) & octaves;
  while( true ) {
    bVar6 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar6) break;
    dVar13 = 1.0 / freq;
    auVar11._0_8_ = x / dVar13;
    auVar11._8_8_ = 0;
    auVar11 = vroundsd_avx(auVar11,auVar11,9);
    iVar5 = (int)auVar11._0_8_;
    if (CH_PAseed != 0) {
      CH_PAseed = (long)(iVar5 + 0x3039);
    }
    ChRandom();
    ChRandom();
    ChRandom();
    dVar8 = ChRandom();
    if (CH_PAseed != 0) {
      CH_PAseed = (long)(iVar5 + 0x303a);
    }
    dVar8 = amp * (dVar8 + -0.5);
    dVar10 = dVar13 * auVar11._0_8_;
    ChRandom();
    ChRandom();
    ChRandom();
    dVar9 = ChRandom();
    dVar13 = (x - dVar10) / ((dVar13 + dVar10) - dVar10);
    dVar10 = pow(dVar13,3.0);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar13 * dVar13;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar10 * -2.0;
    auVar11 = vfmadd231sd_fma(auVar12,ZEXT816(0x4008000000000000),auVar1);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (dVar9 + -0.5) * amp - dVar8;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar8;
    auVar11 = vfmadd213sd_fma(auVar11,auVar14,auVar2);
    freq = freq + freq;
    dVar7 = dVar7 + auVar11._0_8_;
    amp = amp * amp_ratio;
  }
  CH_PAseed = lVar3;
  return dVar7;
}

Assistant:

double ChNoise(double x, double amp, double freq, int octaves, double amp_ratio) {
    double ret = 0;
    long oldseed = CH_PAseed;
    double o_freq, o_amp, xA, xB, yA, yB, period;
    int iA, iB;

    o_freq = freq;
    o_amp = amp;

    for (int i = 1; i <= octaves; i++) {
        period = 1.0 / o_freq;
        xA = period * floor(x / period);
        xB = xA + period;
        iA = int(floor(x / period));
        iB = iA + 1;
        ChSetRandomSeed((long)(iA + 12345));
        ChRandom();
        ChRandom();
        ChRandom();  // just to puzzle the seed..
        yA = (ChRandom() - 0.5) * o_amp;
        ChSetRandomSeed((long)(iB + 12345));
        ChRandom();
        ChRandom();
        ChRandom();  // just to puzzle the seed..
        yB = (ChRandom() - 0.5) * o_amp;
        // cubic noise interpolation from (xA,yA) to (xB,yB), with flat extremal derivatives
        ret += yA + (yB - yA) * ((3 * (pow(((x - xA) / (xB - xA)), 2))) - 2 * (pow(((x - xA) / (xB - xA)), 3)));
        // for following octave, reduce amplitude...
        o_amp *= amp_ratio;
        o_freq *= 2.0;
    }
    // restore previous seed
    CH_PAseed = oldseed;
    return ret;
}